

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lower_shared_reference.cpp
# Opt level: O0

void lower_shared_reference(gl_context *ctx,gl_shader_program *prog,gl_linked_shader *shader)

{
  undefined1 local_80 [8];
  lower_shared_reference_visitor v;
  gl_linked_shader *shader_local;
  gl_shader_program *prog_local;
  gl_context *ctx_local;
  
  if (shader->Stage == MESA_SHADER_COMPUTE) {
    v._88_8_ = shader;
    anon_unknown.dwarf_55e35::lower_shared_reference_visitor::lower_shared_reference_visitor
              ((lower_shared_reference_visitor *)local_80,shader);
    do {
      v.var_offsets.next._4_1_ = 0;
      visit_list_elements((ir_hierarchical_visitor *)local_80,*(exec_list **)(v._88_8_ + 0x20),true)
      ;
    } while ((v.var_offsets.next._4_1_ & 1) != 0);
    (prog->Comp).SharedSize = (uint)v.var_offsets.next;
    if ((ctx->Const).MaxComputeSharedMemorySize < (prog->Comp).SharedSize) {
      linker_error(prog,"Too much shared memory used (%u/%u)\n",(ulong)(prog->Comp).SharedSize,
                   (ulong)(ctx->Const).MaxComputeSharedMemorySize);
    }
    anon_unknown.dwarf_55e35::lower_shared_reference_visitor::~lower_shared_reference_visitor
              ((lower_shared_reference_visitor *)local_80);
  }
  return;
}

Assistant:

void
lower_shared_reference(struct gl_context *ctx,
                       struct gl_shader_program *prog,
                       struct gl_linked_shader *shader)
{
   if (shader->Stage != MESA_SHADER_COMPUTE)
      return;

   lower_shared_reference_visitor v(shader);

   /* Loop over the instructions lowering references, because we take a deref
    * of an shared variable array using a shared variable dereference as the
    * index will produce a collection of instructions all of which have cloned
    * shared variable dereferences for that array index.
    */
   do {
      v.progress = false;
      visit_list_elements(&v, shader->ir);
   } while (v.progress);

   prog->Comp.SharedSize = v.shared_size;

   /* Section 19.1 (Compute Shader Variables) of the OpenGL 4.5 (Core Profile)
    * specification says:
    *
    *   "There is a limit to the total size of all variables declared as
    *    shared in a single program object. This limit, expressed in units of
    *    basic machine units, may be queried as the value of
    *    MAX_COMPUTE_SHARED_MEMORY_SIZE."
    */
   if (prog->Comp.SharedSize > ctx->Const.MaxComputeSharedMemorySize) {
      linker_error(prog, "Too much shared memory used (%u/%u)\n",
                   prog->Comp.SharedSize,
                   ctx->Const.MaxComputeSharedMemorySize);
   }
}